

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O0

int MetaSim::GnuPlotOutput::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  byte bVar2;
  undefined7 extraout_var;
  reference ppBVar3;
  ostream *poVar4;
  undefined8 uVar5;
  ofstream f;
  BaseStat *p;
  const_iterator i;
  BaseStat *in_stack_fffffffffffffc68;
  ostream *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  allocator *s;
  allocator *this;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [96];
  string local_288 [32];
  ostream local_268 [512];
  string local_68 [48];
  string local_38 [32];
  BaseStat *local_18;
  _Self local_10;
  _Self local_8;
  
  local_8._M_node = (_List_node_base *)BaseStat::begin();
  do {
    local_10._M_node = (_List_node_base *)BaseStat::end();
    bVar1 = std::operator!=(&local_8,&local_10);
    if (!bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    ppBVar3 = std::_List_const_iterator<MetaSim::BaseStat_*>::operator*
                        ((_List_const_iterator<MetaSim::BaseStat_*> *)in_stack_fffffffffffffc70);
    local_18 = *ppBVar3;
    poVar4 = std::operator<<((ostream *)&std::cout,"Name: ");
    BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffc68);
    poVar4 = std::operator<<(poVar4,local_38);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_38);
    BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffc68);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_68);
    if (bVar1) {
      BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffc68);
      uVar5 = std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_268,uVar5,0x10);
      std::__cxx11::string::~string(local_288);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        local_312 = 1;
        uVar5 = __cxa_allocate_exception(0x30);
        BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffc68);
        std::operator+(in_stack_fffffffffffffc78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70);
        this = &local_2e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2e8,"GnuPlotOutput",this);
        s = &local_311;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,"basestat.hpp",s);
        Exc::Exc((Exc *)this,(string *)s,(string *)in_stack_fffffffffffffc70,
                 (string *)in_stack_fffffffffffffc68);
        local_312 = 0;
        __cxa_throw(uVar5,&Exc::typeinfo,Exc::~Exc);
      }
      in_stack_fffffffffffffc70 = std::operator<<(local_268,"# ");
      BaseStat::getName_abi_cxx11_(in_stack_fffffffffffffc68);
      in_stack_fffffffffffffc68 = (BaseStat *)std::operator<<(in_stack_fffffffffffffc70,local_338);
      std::ostream::operator<<(in_stack_fffffffffffffc68,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_338);
      std::ofstream::~ofstream(local_268);
    }
    std::_List_const_iterator<MetaSim::BaseStat_*>::operator++(&local_8);
  } while( true );
}

Assistant:

void GnuPlotOutput::init()
    {
        BaseStat::List::const_iterator i  = BaseStat::begin();
        while (i != BaseStat::end()) {
            BaseStat* p = *i;
            cout << "Name: " << p->getName() << endl;

            if (p->getName() != "") {
                ofstream f(p->getName().c_str());

                if (!f.is_open())
                    throw Exc("Cannot open file " + p->getName());

                f << "# " << p->getName() << endl;
            }
            ++i;
        }
    }